

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool google::protobuf::anon_unknown_1::RetrieveOptionsAssumingRightPool
               (int depth,Message *options,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *option_entries)

{
  pointer pbVar1;
  pointer pbVar2;
  int iVar3;
  int iVar4;
  CppType CVar5;
  undefined4 extraout_var;
  int iVar7;
  int iVar8;
  ulong uVar9;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  string tmp;
  string fieldval;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string name;
  long *plVar6;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(option_entries);
  iVar3 = (*(options->super_MessageLite)._vptr_MessageLite[0x16])(options);
  plVar6 = (long *)CONCAT44(extraout_var,iVar3);
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (**(code **)(*plVar6 + 0x80))(plVar6,options);
  for (uVar9 = 0;
      uVar9 < (ulong)((long)fields.
                            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)fields.
                            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar9 = uVar9 + 1) {
    iVar3 = *(int *)(fields.
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar9] + 0x4c);
    iVar4 = 1;
    if (iVar3 == 3) {
      iVar4 = (**(code **)(*plVar6 + 0x30))(plVar6,options);
    }
    iVar8 = 0;
    if (iVar4 < 1) {
      iVar4 = iVar8;
    }
    for (; iVar4 != iVar8; iVar8 = iVar8 + 1) {
      fieldval._M_dataplus._M_p = (pointer)&fieldval.field_2;
      fieldval._M_string_length = 0;
      fieldval.field_2._M_local_buf[0] = '\0';
      CVar5 = FieldDescriptor::cpp_type
                        (fields.
                         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar9]);
      if (CVar5 == CPPTYPE_MESSAGE) {
        tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
        tmp._M_string_length = 0;
        tmp.field_2._M_local_buf[0] = '\0';
        TextFormat::Printer::Printer((Printer *)&name);
        name._M_dataplus._M_p._0_4_ = depth + 1;
        iVar7 = -1;
        if (iVar3 == 3) {
          iVar7 = iVar8;
        }
        TextFormat::Printer::PrintFieldValueToString
                  ((Printer *)&name,options,
                   fields.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar9],iVar7,&tmp);
        std::__cxx11::string::append((char *)&fieldval);
        std::__cxx11::string::append((string *)&fieldval);
        std::__cxx11::string::append((ulong)&fieldval,(char)depth * '\x02');
        std::__cxx11::string::append((char *)&fieldval);
        TextFormat::Printer::~Printer((Printer *)&name);
        std::__cxx11::string::~string((string *)&tmp);
      }
      else {
        iVar7 = -1;
        if (iVar3 == 3) {
          iVar7 = iVar8;
        }
        TextFormat::PrintFieldValueToString
                  (options,fields.
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar9],iVar7,&fieldval);
      }
      name._M_dataplus._M_p = (pointer)&name.field_2;
      name._M_string_length = 0;
      name.field_2._M_local_buf[0] = '\0';
      if (fields.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar9][0x50] == (FieldDescriptor)0x1) {
        std::operator+(&local_a0,"(.",
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (fields.
                         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar9] + 8));
        std::operator+(&tmp,&local_a0,")");
        std::__cxx11::string::operator=((string *)&name,(string *)&tmp);
        std::__cxx11::string::~string((string *)&tmp);
        std::__cxx11::string::~string((string *)&local_a0);
      }
      else {
        std::__cxx11::string::_M_assign((string *)&name);
      }
      std::operator+(&local_a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&name,
                     " = ");
      std::operator+(&tmp,&local_a0,&fieldval);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)option_entries
                 ,&tmp);
      std::__cxx11::string::~string((string *)&tmp);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::~string((string *)&fieldval);
    }
  }
  pbVar1 = (option_entries->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (option_entries->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  std::
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~_Vector_base(&fields.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 );
  return pbVar1 != pbVar2;
}

Assistant:

bool RetrieveOptionsAssumingRightPool(int depth, const Message& options,
                                      std::vector<string>* option_entries) {
  option_entries->clear();
  const Reflection* reflection = options.GetReflection();
  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(options, &fields);
  for (int i = 0; i < fields.size(); i++) {
    int count = 1;
    bool repeated = false;
    if (fields[i]->is_repeated()) {
      count = reflection->FieldSize(options, fields[i]);
      repeated = true;
    }
    for (int j = 0; j < count; j++) {
      string fieldval;
      if (fields[i]->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
        string tmp;
        TextFormat::Printer printer;
        printer.SetInitialIndentLevel(depth + 1);
        printer.PrintFieldValueToString(options, fields[i],
                                        repeated ? j : -1, &tmp);
        fieldval.append("{\n");
        fieldval.append(tmp);
        fieldval.append(depth * 2, ' ');
        fieldval.append("}");
      } else {
        TextFormat::PrintFieldValueToString(options, fields[i],
                                            repeated ? j : -1, &fieldval);
      }
      string name;
      if (fields[i]->is_extension()) {
        name = "(." + fields[i]->full_name() + ")";
      } else {
        name = fields[i]->name();
      }
      option_entries->push_back(name + " = " + fieldval);
    }
  }
  return !option_entries->empty();
}